

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_write
                    (ma_vfs *pVFS,ma_vfs_file file,void *pSrc,size_t sizeInBytes,
                    size_t *pBytesWritten)

{
  void *in_RCX;
  ma_vfs_file in_RDX;
  ma_vfs *in_RSI;
  undefined8 *in_R8;
  size_t *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  if ((in_RSI == (ma_vfs *)0x0) || (in_RDX == (ma_vfs_file)0x0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = ma_default_vfs_write__stdio
                        (in_RSI,in_RDX,in_RCX,(size_t)in_R8,in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

static ma_result ma_default_vfs_write(ma_vfs* pVFS, ma_vfs_file file, const void* pSrc, size_t sizeInBytes, size_t* pBytesWritten)
{
    if (pBytesWritten != NULL) {
        *pBytesWritten = 0;
    }

    if (file == NULL || pSrc == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_write__win32(pVFS, file, pSrc, sizeInBytes, pBytesWritten);
#else
    return ma_default_vfs_write__stdio(pVFS, file, pSrc, sizeInBytes, pBytesWritten);
#endif
}